

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

int duckdb_shell_sqlite3_bind_text
              (sqlite3_stmt *stmt,int idx,char *val,int length,_func_void_void_ptr *free_func)

{
  int iVar1;
  size_t sVar2;
  string value;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  Value local_70;
  
  if (val == (char *)0x0) {
    iVar1 = 0x15;
  }
  else {
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    if (length < 0) {
      local_b0[0] = local_a0;
      sVar2 = strlen(val);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,val,val + sVar2);
    }
    else {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,val,val + (uint)length);
    }
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (&DAT_00000001 < free_func + 1) {
      (*free_func)(val);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_d0 + local_c8);
    duckdb::Value::Value(&local_70,&local_90);
    iVar1 = sqlite3_internal_bind_value(stmt,idx,&local_70);
    duckdb::Value::~Value(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
  }
  return iVar1;
}

Assistant:

int sqlite3_bind_text(sqlite3_stmt *stmt, int idx, const char *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	string value;
	if (length < 0) {
		value = string(val);
	} else {
		value = string(val, length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, Value(value));
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}